

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O2

int fetch_all_fare_rules_db(feed_db_t *db,fare_rule_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  fare_rule_t *pfVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  sqlite3_stmt *stmt;
  uint local_1cc;
  fare_rule_t record;
  char qr [84];
  
  bVar9 = 0;
  uVar2 = count_rows_db(db,"fare_rules");
  if (0 < (int)uVar2) {
    pcVar7 = "SELECT fare_id, route_id, origin_id, destination_id, contains_id FROM `fare_rules`;";
    pcVar8 = qr;
    for (lVar6 = 0x54; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pcVar8 = *pcVar7;
      pcVar7 = pcVar7 + (ulong)bVar9 * -2 + 1;
      pcVar8 = pcVar8 + (ulong)bVar9 * -2 + 1;
    }
    sqlite3_prepare_v2(db->conn,qr,-1,&stmt,(char **)0x0);
    pfVar4 = (fare_rule_t *)malloc((ulong)uVar2 * 0x140);
    *records = pfVar4;
    uVar1 = 0xffffffff;
    if (pfVar4 != (fare_rule_t *)0x0) {
      lVar6 = 0;
      local_1cc = uVar2;
      do {
        iVar3 = sqlite3_step(stmt);
        db->rc = iVar3;
        uVar1 = local_1cc;
        if (iVar3 != 100) break;
        init_fare_rule(&record);
        puVar5 = sqlite3_column_text(stmt,0);
        strcpy(record.fare_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,1);
        strcpy(record.route_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,2);
        strcpy(record.origin_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,3);
        strcpy(record.destination_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,4);
        strcpy(record.contains_id,(char *)puVar5);
        memcpy((*records)->fare_id + lVar6,&record,0x140);
        lVar6 = lVar6 + 0x140;
        uVar1 = local_1cc;
      } while ((ulong)uVar2 * 0x140 - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(stmt);
  }
  return uVar2;
}

Assistant:

int fetch_all_fare_rules_db(feed_db_t *db, fare_rule_t **records) {

    fare_rule_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "fare_rules");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "fare_id, route_id, origin_id, destination_id, contains_id "
                "FROM `fare_rules`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_fare_rule(&record);

        strcpy(record.fare_id, sqlite3_column_text(stmt, 0));
        strcpy(record.route_id, sqlite3_column_text(stmt, 1));
        strcpy(record.origin_id, sqlite3_column_text(stmt, 2));
        strcpy(record.destination_id, sqlite3_column_text(stmt, 3));
        strcpy(record.contains_id, sqlite3_column_text(stmt, 4));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}